

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaAttributeGroupPtr_conflict
xmlSchemaParseAttributeGroupDefinition
          (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  xmlChar *refTargetNs;
  _xmlAttr *p_Var1;
  int iVar2;
  xmlAttrPtr ownerItem;
  xmlSchemaTypePtr attr;
  undefined4 extraout_var;
  xmlSchemaAttributeGroupPtr_conflict extraout_RAX;
  undefined8 *item;
  xmlSchemaRedefPtr_conflict pxVar3;
  xmlSchemaAnnotPtr pxVar4;
  undefined4 extraout_var_00;
  xmlSchemaAttributeGroupPtr_conflict pxVar5;
  xmlSchemaAttributeGroupPtr_conflict extraout_RAX_00;
  xmlSchemaAttributeGroupPtr_conflict extraout_RAX_01;
  xmlNodePtr in_RCX;
  xmlSchemaTypePtr type;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr pxVar6;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlChar **in_R8;
  char *in_R9;
  xmlNodePtr node_00;
  int hasRefs;
  xmlChar *name;
  xmlNodePtr pxVar7;
  int local_3c;
  xmlSchemaTypePtr local_38;
  
  local_3c = 0;
  ownerItem = xmlSchemaGetPropNode(node,"name");
  if (ownerItem == (xmlAttrPtr)0x0) {
    xmlSchemaPMissingAttrErr
              (pctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1c9054,in_RCX,(char *)in_R8,
               in_R9);
    return extraout_RAX;
  }
  attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
  type = (xmlSchemaTypePtr)&local_38;
  iVar2 = xmlSchemaPValAttrNode(pctxt,(xmlSchemaBasicItemPtr)ownerItem,(xmlAttrPtr)attr,type,in_R8);
  if (iVar2 != 0) {
    return (xmlSchemaAttributeGroupPtr_conflict)CONCAT44(extraout_var,iVar2);
  }
  if (local_38 == (xmlSchemaTypePtr)0x0) {
    return (xmlSchemaAttributeGroupPtr_conflict)CONCAT44(extraout_var,iVar2);
  }
  refTargetNs = pctxt->targetNamespace;
  item = (undefined8 *)(*xmlMalloc)(0x78);
  if (item == (undefined8 *)0x0) {
    xmlSchemaPErrMemory(pctxt);
    return extraout_RAX_01;
  }
  *item = 0;
  item[1] = 0;
  item[2] = 0;
  item[3] = 0;
  item[0xc] = 0;
  item[0xd] = 0;
  item[8] = 0;
  item[9] = 0;
  item[10] = 0;
  item[0xb] = 0;
  item[6] = 0;
  item[7] = 0;
  item[4] = 0;
  item[5] = 0;
  item[0xe] = 0;
  *(undefined4 *)item = 0x10;
  item[2] = local_38;
  item[0xd] = refTargetNs;
  item[8] = node;
  *(undefined4 *)(item + 9) = 2;
  if (pctxt->isRedefine != 0) {
    pxVar3 = xmlSchemaAddRedef(pctxt,pctxt->redefined,item,(xmlChar *)local_38,refTargetNs);
    pctxt->redef = pxVar3;
    if (pxVar3 == (xmlSchemaRedefPtr_conflict)0x0) goto LAB_001962aa;
    pctxt->redefCounter = 0;
    type = local_38;
  }
  iVar2 = xmlSchemaAddItemSize(&pctxt->constructor->bucket->globals,5,item);
  if (-1 < iVar2) {
    iVar2 = xmlSchemaAddItemSize(&pctxt->constructor->pending,10,item);
    pxVar6 = extraout_RDX;
    if (iVar2 < 0) {
      xmlSchemaPErrMemory(pctxt);
      pxVar6 = extraout_RDX_00;
    }
    p_Var1 = node->properties;
    do {
      if (p_Var1 == (_xmlAttr *)0x0) {
        xmlSchemaPValAttrID(pctxt,node,(xmlChar *)pxVar6);
        pxVar7 = node->children;
        node_00 = pxVar7;
        if ((((pxVar7 != (xmlNodePtr)0x0) && (pxVar7->ns != (xmlNs *)0x0)) &&
            (iVar2 = xmlStrEqual(pxVar7->name,(xmlChar *)"annotation"), iVar2 != 0)) &&
           (iVar2 = xmlStrEqual(pxVar7->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar2 != 0)) {
          pxVar4 = xmlSchemaParseAnnotation(pctxt,pxVar7,1);
          item[6] = pxVar4;
          node_00 = pxVar7->next;
        }
        iVar2 = xmlSchemaParseLocalAttributes
                          (pctxt,schema,(xmlNodePtr *)&stack0xffffffffffffffb8,
                           (xmlSchemaItemListPtr *)(item + 0xe),0x10,&local_3c);
        if (local_3c != 0) {
          *(byte *)(item + 9) = *(byte *)(item + 9) | 0x10;
        }
        if (iVar2 == -1) {
          return (xmlSchemaAttributeGroupPtr_conflict)CONCAT44(extraout_var_00,iVar2);
        }
        if (node_00 == (xmlNodePtr)0x0) {
          return (xmlSchemaAttributeGroupPtr_conflict)CONCAT44(extraout_var_00,iVar2);
        }
        pxVar7 = node_00;
        if (((node_00->ns != (xmlNs *)0x0) &&
            (iVar2 = xmlStrEqual(node_00->name,(xmlChar *)"anyAttribute"), iVar2 != 0)) &&
           (iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar2 != 0)) {
          pxVar5 = (xmlSchemaAttributeGroupPtr_conflict)
                   xmlSchemaParseAnyAttribute(pctxt,schema,node_00);
          item[10] = pxVar5;
          node_00 = node_00->next;
          if (node_00 == (xmlNodePtr)0x0) {
            return pxVar5;
          }
        }
        xmlSchemaPContentErr
                  (pctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,node_00,
                   (xmlNodePtr)0x0,"(annotation?, ((attribute | attributeGroup)*, anyAttribute?))",
                   (char *)pxVar7);
        return extraout_RAX_00;
      }
      if (p_Var1->ns == (xmlNs *)0x0) {
        iVar2 = xmlStrEqual(p_Var1->name,"name");
        pxVar6 = extraout_RDX_03;
        if ((iVar2 == 0) &&
           (iVar2 = xmlStrEqual(p_Var1->name,"id"), pxVar6 = extraout_RDX_04, iVar2 == 0))
        goto LAB_00196119;
      }
      else {
        iVar2 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar6 = extraout_RDX_01;
        if (iVar2 != 0) {
LAB_00196119:
          xmlSchemaPIllegalAttrErr(pctxt,(xmlParserErrors)p_Var1,pxVar6,(xmlAttrPtr)type);
          pxVar6 = extraout_RDX_02;
        }
      }
      p_Var1 = p_Var1->next;
    } while( true );
  }
  pctxt->nberrors = pctxt->nberrors + 1;
  pctxt->err = 2;
  xmlRaiseMemoryError(pctxt->serror,pctxt->error,pctxt->errCtxt,0x10,(xmlError *)0x0);
LAB_001962aa:
  pxVar5 = (xmlSchemaAttributeGroupPtr_conflict)(*xmlFree)(item);
  return pxVar5;
}

Assistant:

static xmlSchemaAttributeGroupPtr
xmlSchemaParseAttributeGroupDefinition(xmlSchemaParserCtxtPtr pctxt,
				       xmlSchemaPtr schema,
				       xmlNodePtr node)
{
    const xmlChar *name;
    xmlSchemaAttributeGroupPtr ret;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    int hasRefs = 0;
    int res;

    if ((pctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    attr = xmlSchemaGetPropNode(node, "name");
    if (attr == NULL) {
	xmlSchemaPMissingAttrErr(pctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node, "name", NULL);
	return (NULL);
    }
    /*
    * The name is crucial, exit if invalid.
    */
    if (xmlSchemaPValAttrNode(pctxt,
	NULL, attr,
	xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0) {
	return (NULL);
    }
    ret = xmlSchemaAddAttributeGroupDefinition(pctxt, schema,
	name, pctxt->targetNamespace, node);
    if (ret == NULL)
	return (NULL);
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "id")))
	    {
		xmlSchemaPIllegalAttrErr(pctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(pctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    /* Attribute ID */
    xmlSchemaPValAttrID(pctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        ret->annot = xmlSchemaParseAnnotation(pctxt, child, 1);
        child = child->next;
    }
    /*
    * Parse contained attribute decls/refs.
    */
    res = xmlSchemaParseLocalAttributes(pctxt, schema, &child,
	(xmlSchemaItemListPtr *) &(ret->attrUses),
	XML_SCHEMA_TYPE_ATTRIBUTEGROUP, &hasRefs);
    if (hasRefs)
	ret->flags |= XML_SCHEMAS_ATTRGROUP_HAS_REFS;
    if (res == -1)
	return(NULL);
    /*
    * Parse the attribute wildcard.
    */
    if (IS_SCHEMA(child, "anyAttribute")) {
	ret->attributeWildcard = xmlSchemaParseAnyAttribute(pctxt,
	    schema, child);
	child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(pctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, ((attribute | attributeGroup)*, anyAttribute?))");
    }
    return (ret);
}